

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-reader.c
# Opt level: O1

int check_long_utf16(void)

{
  int iVar1;
  uchar *input;
  ulong uVar2;
  uchar uVar3;
  uint uVar4;
  byte bVar5;
  yaml_parser_t parser;
  yaml_parser_t local_200;
  
  input = (uchar *)malloc(0x30d42);
  if (input == (uchar *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/tests/test-reader.c"
                  ,0x11f,"int check_long_utf16(void)");
  }
  puts("checking a long utf16 sequence...");
  input[0] = 0xff;
  input[1] = 0xfe;
  uVar2 = 0;
  do {
    uVar3 = '\x10';
    if ((uVar2 & 1) == 0) {
      uVar3 = '/';
    }
    input[uVar2 * 2 + 2] = uVar3;
    input[uVar2 * 2 + 3] = '\x04';
    uVar2 = uVar2 + 1;
  } while ((int)uVar2 != 100000);
  yaml_parser_initialize(&local_200);
  yaml_parser_set_input_string(&local_200,input,0x30d42);
  uVar2 = 0;
  do {
    if (local_200.unread == 0) {
      iVar1 = yaml_parser_update_buffer(&local_200,1);
      if (iVar1 == 0) goto LAB_00102841;
    }
    if (local_200.unread == 0) {
      printf("\tnot enough characters at %d\n",uVar2);
      goto LAB_00102859;
    }
    bVar5 = 0x90;
    if ((uVar2 & 1) == 0) {
      bVar5 = 0xaf;
    }
    if ((*local_200.buffer.pointer != 0xd0) || (bVar5 != local_200.buffer.pointer[1])) {
      printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",(ulong)*local_200.buffer.pointer
             ,(ulong)local_200.buffer.pointer[1],0xd0);
      goto LAB_00102859;
    }
    local_200.buffer.pointer = local_200.buffer.pointer + 2;
    local_200.unread = local_200.unread - 1;
    uVar4 = (int)uVar2 + 1;
    uVar2 = (ulong)uVar4;
  } while (uVar4 != 100000);
  iVar1 = yaml_parser_update_buffer(&local_200,1);
  if (iVar1 == 0) {
LAB_00102841:
    printf("\treader error: %s at %ld\n",local_200.problem,local_200.problem_offset);
  }
  else {
    if (*local_200.buffer.pointer == 0) {
      uVar4 = 0;
      goto LAB_0010285e;
    }
    printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n",(ulong)*local_200.buffer.pointer,
           (ulong)(uint)local_200.eof,local_200.unread);
  }
LAB_00102859:
  uVar4 = 1;
LAB_0010285e:
  yaml_parser_delete(&local_200);
  free(input);
  printf("checking a long utf16 sequence: %d fail(s)\n",(ulong)uVar4);
  return uVar4;
}

Assistant:

int check_long_utf16(void)
{
    yaml_parser_t parser;
    int k = 0;
    int j;
    int failed = 0;
    unsigned char ch0, ch1;
    unsigned char *buffer = (unsigned char *)malloc(2+LONG*2);
    assert(buffer);
    printf("checking a long utf16 sequence...\n");
    buffer[k++] = '\xff';
    buffer[k++] = '\xfe';
    for (j = 0; j < LONG; j ++) {
        if (j % 2) {
            buffer[k++] = '\x10';
            buffer[k++] = '\x04';
        }
        else {
            buffer[k++] = '/';
            buffer[k++] = '\x04';
        }
    }
    yaml_parser_initialize(&parser);
    yaml_parser_set_input_string(&parser, buffer, 2+LONG*2);
    for (k = 0; k < LONG; k++) {
        if (!parser.unread) {
            if (!yaml_parser_update_buffer(&parser, 1)) {
                printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
                failed = 1;
                break;
            }
        }
        if (!parser.unread) {
            printf("\tnot enough characters at %d\n", k);
            failed = 1;
            break;
        }
        if (k % 2) {
            ch0 = '\xd0';
            ch1 = '\x90';
        }
        else {
            ch0 = '\xd0';
            ch1 = '\xaf';
        }
        if (parser.buffer.pointer[0] != ch0 || parser.buffer.pointer[1] != ch1) {
            printf("\tincorrect UTF-8 sequence: %X %X instead of %X %X\n",
                    (int)parser.buffer.pointer[0], (int)parser.buffer.pointer[1],
                    (int)ch0, (int)ch1);
            failed = 1;
            break;
        }
        parser.buffer.pointer += 2;
        parser.unread -= 1;
    }
    if (!failed) {
        if (!yaml_parser_update_buffer(&parser, 1)) {
            printf("\treader error: %s at %ld\n", parser.problem, (long)parser.problem_offset);
            failed = 1;
        }
        else if (parser.buffer.pointer[0] != '\0') {
            printf("\texpected NUL, found %X (eof=%d, unread=%ld)\n", (int)parser.buffer.pointer[0], parser.eof, (long)parser.unread);
            failed = 1;
        }
    }
    yaml_parser_delete(&parser);
    free(buffer);
    printf("checking a long utf16 sequence: %d fail(s)\n", failed);
    return failed;
}